

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgproc.cpp
# Opt level: O0

void enhanceContrastLinearly
               (Image *src,Histogram *src_hist,Image *dest,int low,int high,int channel)

{
  uchar uVar1;
  int iVar2;
  Pixel *pPVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int x;
  int y;
  uchar offset;
  float scale;
  uchar last;
  uchar first;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  undefined2 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffba;
  bool bVar4;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  uint local_38;
  uint local_34;
  byte local_26;
  byte local_25;
  
  bVar4 = false;
  if ((in_RDI != 0) && (bVar4 = false, in_RSI != 0)) {
    bVar4 = in_RDX != 0;
  }
  if (bVar4 != false) {
    checkDimensionsEqualOrThrow
              ((Image *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (Image *)CONCAT44(in_stack_ffffffffffffffbc,
                                 CONCAT13(bVar4,CONCAT12(in_stack_ffffffffffffffba,
                                                         in_stack_ffffffffffffffb8))));
    checkValidColorChannelOrThrow(in_stack_ffffffffffffffc4);
    local_25 = 0;
    while (((int)(uint)local_25 < *(int *)(in_RSI + 4) &&
           (iVar2 = Histogram::count((Histogram *)
                                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                     (uchar)((uint)in_stack_ffffffffffffffac >> 0x18),
                                     in_stack_ffffffffffffffa8), iVar2 <= in_ECX))) {
      local_25 = local_25 + 1;
    }
    local_26 = 0xff;
    while ((local_25 < local_26 &&
           (iVar2 = Histogram::count((Histogram *)
                                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                     (uchar)((uint)in_stack_ffffffffffffffac >> 0x18),
                                     in_stack_ffffffffffffffa8), iVar2 <= in_R8D))) {
      local_26 = local_26 - 1;
    }
    for (local_34 = 0; local_34 < *(uint *)(in_RDI + 0x24); local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < *(uint *)(in_RDI + 0x20); local_38 = local_38 + 1) {
        Image::pixel((Image *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0,
                     0x11e804);
        if ((byte)(&stack0xffffffffffffffc4)[in_R9D] < local_25) {
          pPVar3 = Image::pixel((Image *)CONCAT44(in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
          pPVar3->colors[in_R9D] = '\0';
        }
        else {
          Image::pixel((Image *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0,
                       0x11e84d);
          if (local_26 < (byte)(&stack0xffffffffffffffc0)[in_R9D]) {
            pPVar3 = Image::pixel((Image *)CONCAT44(in_stack_ffffffffffffffb4,
                                                    in_stack_ffffffffffffffb0),
                                  in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
            pPVar3->colors[in_R9D] = 0xff;
          }
          else {
            in_stack_ffffffffffffffb4 = 255.0 / (float)(int)((uint)local_26 - (uint)local_25);
            Image::pixel((Image *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0,
                         0x11e89f);
            uVar1 = (uchar)(int)(in_stack_ffffffffffffffb4 *
                                (float)(int)((uint)(byte)(&stack0xffffffffffffffbc)[in_R9D] -
                                            (uint)local_25));
            pPVar3 = Image::pixel((Image *)CONCAT44(in_stack_ffffffffffffffb4,
                                                    in_stack_ffffffffffffffb0),
                                  in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
            pPVar3->colors[in_R9D] = uVar1;
          }
        }
      }
    }
    return;
  }
  __assert_fail("(src != nullptr) && (src_hist != nullptr) && (dest != nullptr)",
                "/workspace/llm4binary/github/license_c_cmakelists/acstud[P]lab2/src/baseline/imgproc.cpp"
                ,0x58,
                "void enhanceContrastLinearly(const Image *, const Histogram *, Image *, int, int, int)"
               );
}

Assistant:

void enhanceContrastLinearly(const Image *src, const Histogram *src_hist, Image *dest, int low, int high, int channel) {
  // Check arguments
  assert((src != nullptr) && (src_hist != nullptr) && (dest != nullptr));
  checkDimensionsEqualOrThrow(src, dest);
  checkValidColorChannelOrThrow(channel);

  unsigned char first = 0;
  unsigned char last = 255;

  // Obtain the first intensity that is above the threshold.
  for (first = 0; first < src_hist->range; first++) {
    if (src_hist->count(first, channel) > low) {
      break;
    }
  }

  // Obtain the first intensity that is above the threshold.
  for (last = 255; last > first; last--) {
    if (src_hist->count(last, channel) > high) {
      break;
    }
  }

  // Obtain the scaling factor and offset.
  float scale = 255.0f / (last - first);
  auto offset = first;

  // For every pixel
  for (int y = 0; y < src->height; y++) {
    for (int x = 0; x < src->width; x++) {
      // Clamp anything above and below the threshold to 0...255
      if (src->pixel(x, y).colors[channel] < first) {
        dest->pixel(x, y).colors[channel] = 0;
      } else if (src->pixel(x, y).colors[channel] > last) {
        dest->pixel(x, y).colors[channel] = 255;
      } else {
        // Anything else is scaled
        dest->pixel(x, y).colors[channel] = (unsigned char) (scale * (src->pixel(x, y).colors[channel] - offset));
      }
    }
  }

}